

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

bool __thiscall pbrt::SquareMatrix<2>::IsIdentity(SquareMatrix<2> *this)

{
  float fVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  
  lVar3 = 0;
  bVar2 = true;
  do {
    lVar5 = 0;
    bVar6 = true;
    do {
      bVar4 = bVar6;
      if (lVar3 == lVar5) {
        fVar1 = *(float *)((long)this->m + lVar3 * 0xc);
        bVar6 = fVar1 == 1.0;
      }
      else {
        fVar1 = this->m[lVar3][lVar5];
        bVar6 = fVar1 == 0.0;
      }
      if ((!bVar6) || (NAN(fVar1))) {
        return false;
      }
      lVar5 = 1;
      bVar6 = false;
    } while (bVar4);
    lVar3 = 1;
    bVar6 = !bVar2;
    bVar2 = false;
    if (bVar6) {
      return true;
    }
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    bool IsIdentity() const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j) {
                if (i == j) {
                    if (m[i][j] != 1)
                        return false;
                } else if (m[i][j] != 0)
                    return false;
            }
        return true;
    }